

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matinv.c
# Opt level: O3

MATRIX mat_inv(MATRIX a)

{
  uint row;
  int iVar1;
  MATRIX A;
  MATRIX A_00;
  MATRIX X;
  MATRIX P;
  ulong uVar2;
  
  row = *(uint *)((long)a + -4);
  A = mat_copy(a);
  A_00 = mat_creat(row,1,-1);
  X = mat_creat(row,row,-1);
  P = mat_creat(row,1,-1);
  iVar1 = mat_lu(A,P);
  if (iVar1 == -1) {
    mat_free(A);
    A = A_00;
    A_00 = X;
    X = (MATRIX)0x0;
  }
  else if (0 < (int)row) {
    uVar2 = 0;
    do {
      mat_fill(A_00,0);
      *A_00[uVar2] = 1.0;
      mat_backsubs1(A,A_00,X,P,(int)uVar2);
      uVar2 = uVar2 + 1;
    } while (row != uVar2);
  }
  mat_free(A);
  mat_free(A_00);
  mat_free(P);
  return X;
}

Assistant:

MATRIX mat_inv( MATRIX a )
{
	MATRIX	A, B, C, P;
	int	i, n;

	n = MatCol(a);
	A = mat_copy(a);
	B = mat_creat( n, 1, UNDEFINED );
	C = mat_creat( n, n, UNDEFINED );
	P = mat_creat( n, 1, UNDEFINED );

	/*
	*	- LU-decomposition -
	*	also check for singular matrix
	*/
	if (mat_lu(A, P) == -1)
		{
		mat_free(A);
		mat_free(B);
		mat_free(C);
		mat_free(P);

		return (NULL);
		}

	for (i=0; i<n; i++)
		{
		mat_fill(B, ZERO_MATRIX);
		B[i][0] = 1.0;
		mat_backsubs1( A, B, C, P, i );
		}

	mat_free(A);
	mat_free(B);
	mat_free(P);
	return (C);
}